

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void OptPrint(void)

{
  option_type oVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  s_options *psVar7;
  char *__format;
  char *pcVar8;
  s_options *psVar9;
  char *__s;
  long lVar10;
  
  psVar9 = op;
  __s = op->label;
  if (__s != (char *)0x0) {
    uVar6 = 0;
    psVar7 = op;
    pcVar8 = __s;
    do {
      sVar3 = strlen(pcVar8);
      iVar2 = (int)sVar3;
      uVar4 = iVar2 + 1;
      oVar1 = psVar7->type;
      if (oVar1 < (OPT_FSTR|OPT_FLAG)) {
        if ((0x44U >> (oVar1 & 0x1f) & 1) == 0) {
          if ((0x88U >> (oVar1 & 0x1f) & 1) == 0) {
            if ((0x110U >> (oVar1 & 0x1f) & 1) != 0) {
              uVar4 = iVar2 + 9;
            }
          }
          else {
            uVar4 = iVar2 + 7;
          }
        }
        else {
          uVar4 = iVar2 + 10;
        }
      }
      if ((int)uVar6 < (int)uVar4) {
        uVar6 = uVar4;
      }
      pcVar8 = psVar7[1].label;
      psVar7 = psVar7 + 1;
    } while (pcVar8 != (char *)0x0);
    if (__s != (char *)0x0) {
      lVar10 = 0x20;
      do {
        __stream = errstream;
        switch(psVar9->type) {
        case OPT_FLAG:
        case OPT_FFLAG:
          fprintf((FILE *)errstream,"  -%-*s  %s\n",(ulong)uVar6,__s,psVar9->message);
          goto switchD_00109d9e_default;
        case OPT_INT:
        case OPT_FINT:
          sVar3 = strlen(__s);
          uVar5 = (ulong)((uVar6 - 9) - (int)sVar3);
          pcVar8 = psVar9->message;
          __format = "  -%s<integer>%*s  %s\n";
          break;
        case OPT_DBL:
        case OPT_FDBL:
          sVar3 = strlen(__s);
          uVar5 = (ulong)((uVar6 - 6) - (int)sVar3);
          pcVar8 = psVar9->message;
          __format = "  -%s<real>%*s  %s\n";
          break;
        case OPT_STR:
        case OPT_FSTR:
          sVar3 = strlen(__s);
          uVar5 = (ulong)((uVar6 - 8) - (int)sVar3);
          pcVar8 = psVar9->message;
          __format = "  -%s<string>%*s  %s\n";
          break;
        default:
          goto switchD_00109d9e_default;
        }
        fprintf((FILE *)__stream,__format,__s,uVar5,"",pcVar8);
switchD_00109d9e_default:
        __s = *(char **)((long)&op->label + lVar10);
        psVar9 = (s_options *)((long)&op->type + lVar10);
        lVar10 = lVar10 + 0x20;
      } while (__s != (char *)0x0);
    }
  }
  return;
}

Assistant:

void OptPrint(void){
  int i;
  int max, len;
  max = 0;
  for(i=0; op[i].label; i++){
    len = lemonStrlen(op[i].label) + 1;
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        break;
      case OPT_INT:
      case OPT_FINT:
        len += 9;       /* length of "<integer>" */
        break;
      case OPT_DBL:
      case OPT_FDBL:
        len += 6;       /* length of "<real>" */
        break;
      case OPT_STR:
      case OPT_FSTR:
        len += 8;       /* length of "<string>" */
        break;
    }
    if( len>max ) max = len;
  }
  for(i=0; op[i].label; i++){
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        fprintf(errstream,"  -%-*s  %s\n",max,op[i].label,op[i].message);
        break;
      case OPT_INT:
      case OPT_FINT:
        fprintf(errstream,"  -%s<integer>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-9),"",op[i].message);
        break;
      case OPT_DBL:
      case OPT_FDBL:
        fprintf(errstream,"  -%s<real>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-6),"",op[i].message);
        break;
      case OPT_STR:
      case OPT_FSTR:
        fprintf(errstream,"  -%s<string>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-8),"",op[i].message);
        break;
    }
  }
}